

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tonk.cpp
# Opt level: O1

char * tonk_result_to_string(TonkResult result)

{
  if (result < TonkResult_Count) {
    return &DAT_001971e4 + *(int *)(&DAT_001971e4 + (ulong)result * 4);
  }
  return "Unknown";
}

Assistant:

TONK_EXPORT const char* tonk_result_to_string(TonkResult result)
{
    static_assert(TonkResult_Count == 18, "Update this too");
    switch (result)
    {
    case Tonk_Success: return "Tonk_Success";
    case Tonk_InvalidInput: return "Tonk_InvalidInput";
    case Tonk_Error: return "Tonk_Error";
    case Tonk_HostnameLookup: return "Tonk_HostnameLookup";
    case Tonk_InvalidChannel: return "Tonk_InvalidChannel";
    case Tonk_MessageTooLarge: return "Tonk_MessageTooLarge";
    case Tonk_NetworkFailed: return "Tonk_NetworkFailed";
    case Tonk_PRNGFailed: return "Tonk_PRNGFailed";
    case Tonk_FECFailed: return "Tonk_FECFailed";
    case Tonk_InvalidData: return "Tonk_InvalidData";
    case Tonk_ConnectionRejected: return "Tonk_ConnectionRejected";
    case Tonk_ConnectionTimeout: return "Tonk_ConnectionTimeout";
    case Tonk_AppRequest: return "Tonk_AppRequest";
    case Tonk_RemoteRequest: return "Tonk_RemoteRequest";
    case Tonk_RemoteTimeout: return "Tonk_RemoteTimeout";
    case Tonk_BogonData: return "Tonk_BogonData";
    case Tonk_OOM: return "Tonk_OOM";
    case Tonk_DLL_Not_Found: return "Tonk_DLL_Not_Found";
    default: break;
    }
    return "Unknown";
}